

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O3

void RGBLoop(void)

{
  RGB *color;
  undefined4 in_EAX;
  undefined4 in_register_00000004;
  int i;
  int iVar1;
  int j;
  int iVar2;
  undefined1 uVar3;
  int k;
  int iVar4;
  bool bVar5;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(in_register_00000004,in_EAX);
  color = (RGB *)((long)&uStack_38 + 5);
  iVar2 = 0;
  do {
    iVar4 = 0;
    do {
      uVar3 = (undefined1)iVar4;
      if (iVar2 == 2) {
        iVar1 = 0;
        do {
          uStack_38 = CONCAT17(uVar3,(int7)uStack_38) & 0xff0000ffffffffff;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      else if (iVar2 == 1) {
        iVar1 = 0;
        do {
          uStack_38._0_7_ = CONCAT16(uVar3,(int6)uStack_38) & 0xff00ffffffffff;
          uStack_38 = (ulong)(uint7)uStack_38;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      else if (iVar2 == 0) {
        iVar1 = 0;
        do {
          uStack_38._0_6_ = CONCAT15(uVar3,(undefined5)uStack_38);
          uStack_38 = (ulong)(uint6)uStack_38;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      WS2812B::Led::show(&leds);
      usleep(3000);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x100);
    iVar4 = 0xff;
    do {
      uVar3 = (undefined1)iVar4;
      if (iVar2 == 2) {
        iVar1 = 0;
        do {
          uStack_38 = CONCAT17(uVar3,(int7)uStack_38) & 0xff0000ffffffffff;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      else if (iVar2 == 1) {
        iVar1 = 0;
        do {
          uStack_38._0_7_ = CONCAT16(uVar3,(int6)uStack_38) & 0xff00ffffffffff;
          uStack_38 = (ulong)(uint7)uStack_38;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      else if (iVar2 == 0) {
        iVar1 = 0;
        do {
          uStack_38._0_6_ = CONCAT15(uVar3,(undefined5)uStack_38);
          uStack_38 = (ulong)(uint6)uStack_38;
          WS2812B::Led::setColor(&leds,color,iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x18);
      }
      WS2812B::Led::show(&leds);
      usleep(3000);
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar5);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  return;
}

Assistant:

void RGBLoop() {
    for (int j = 0; j < 3; j++) {
        // Fade IN
        for (int k = 0; k < 256; k++) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
        // Fade OUT
        for (int k = 255; k >= 0; k--) {
            switch (j) {
                case 0:
                    setAll(k, 0, 0);
                    break;
                case 1:
                    setAll(0, k, 0);
                    break;
                case 2:
                    setAll(0, 0, k);
                    break;
            }
            showStrip();
            delay(3);
        }
    }
}